

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

common_control_vector_data *
common_control_vector_load_one(common_control_vector_load_info *load_info)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  common_log *pcVar4;
  long lVar5;
  float *pfVar6;
  float *in_RSI;
  common_control_vector_data *in_RDI;
  int j;
  float *dst;
  float *src;
  ggml_tensor *tensor;
  size_t dotpos;
  int layer_idx;
  string name;
  int i;
  int32_t n_tensors;
  gguf_context *ctx_gguf;
  gguf_init_params meta_gguf_params;
  ggml_context *ctx;
  common_control_vector_data *result;
  size_t *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  common_log *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  common_log *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  bool local_151;
  int local_10c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string local_d8 [39];
  byte local_b1;
  string local_b0 [32];
  long local_90;
  int local_88;
  allocator<char> local_81;
  string local_80 [32];
  int local_60;
  int local_5c;
  int local_58;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  uint local_30;
  undefined4 uStack_2c;
  undefined8 uStack_28;
  char *local_20;
  undefined1 local_11;
  float *local_10;
  
  local_11 = 0;
  in_RDI->n_embd = -1;
  (in_RDI->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_RDI->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_10 = in_RSI;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x32d186);
  local_20 = (char *)0x0;
  local_30 = local_30 & 0xffffff00;
  uStack_28 = &local_20;
  uVar3 = std::__cxx11::string::c_str();
  local_48 = local_30;
  uStack_44 = uStack_2c;
  uStack_40 = (undefined4)uStack_28;
  uStack_3c = uStack_28._4_4_;
  local_38 = gguf_init_from_file(uVar3,local_30,uStack_28);
  if (local_38 == 0) {
    if (-1 < common_log_verbosity_thold) {
      pcVar4 = common_log_main();
      uVar3 = std::__cxx11::string::c_str();
      common_log_add(pcVar4,GGML_LOG_LEVEL_ERROR,"%s: failed to load control vector file from %s\n",
                     "common_control_vector_load_one",uVar3);
    }
  }
  else {
    local_5c = gguf_get_n_tensors(local_38);
    if ((local_5c == 0) && (-1 < common_log_verbosity_thold)) {
      pcVar4 = common_log_main();
      uVar3 = std::__cxx11::string::c_str();
      common_log_add(pcVar4,GGML_LOG_LEVEL_WARN,"%s: no direction tensors found in %s\n",
                     "common_control_vector_load_one",uVar3);
    }
    for (local_60 = 0; local_60 < local_5c; local_60 = local_60 + 1) {
      gguf_get_tensor_name(local_38,(long)local_60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (allocator<char> *)in_stack_fffffffffffffe80);
      std::allocator<char>::~allocator(&local_81);
      local_88 = -1;
      local_90 = std::__cxx11::string::find((char)local_80,0x2e);
      local_b1 = 0;
      local_151 = false;
      if (local_90 != -1) {
        std::__cxx11::string::substr((ulong)local_b0,(ulong)local_80);
        local_b1 = 1;
        local_151 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      }
      if ((local_b1 & 1) != 0) {
        std::__cxx11::string::~string(local_b0);
      }
      if (local_151 != false) {
        std::__cxx11::string::substr((ulong)local_d8,(ulong)local_80);
        local_88 = std::__cxx11::stoi(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,0);
        std::__cxx11::string::~string(local_d8);
      }
      if (local_88 < 0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar4 = common_log_main();
          uVar3 = std::__cxx11::string::c_str();
          common_log_add(pcVar4,GGML_LOG_LEVEL_ERROR,
                         "%s: invalid/unparsable direction tensor layer index in %s\n",
                         "common_control_vector_load_one",uVar3);
        }
        in_RDI->n_embd = -1;
        local_58 = 6;
      }
      else if (local_88 == 0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar4 = common_log_main();
          uVar3 = std::__cxx11::string::c_str();
          common_log_add(pcVar4,GGML_LOG_LEVEL_ERROR,
                         "%s: invalid (zero) direction tensor layer index in %s\n",
                         "common_control_vector_load_one",uVar3);
        }
        in_RDI->n_embd = -1;
        local_58 = 6;
      }
      else {
        in_stack_fffffffffffffe88 = local_20;
        uVar3 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffe90 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ggml_get_tensor(in_stack_fffffffffffffe88,uVar3);
        if (*(int *)in_stack_fffffffffffffe90 == 0) {
          pbVar7 = in_stack_fffffffffffffe90;
          iVar1 = ggml_n_dims(in_stack_fffffffffffffe90);
          if (iVar1 == 1) {
            if (in_RDI->n_embd == -1) {
              iVar2 = ggml_nelements(pbVar7);
              in_RDI->n_embd = iVar2;
            }
            else {
              lVar5 = ggml_nelements(pbVar7);
              if (lVar5 != in_RDI->n_embd) {
                if (-1 < common_log_verbosity_thold) {
                  pcVar4 = common_log_main();
                  uVar3 = std::__cxx11::string::c_str();
                  common_log_add(pcVar4,GGML_LOG_LEVEL_ERROR,
                                 "%s: direction tensor in %s does not match previous dimensions\n",
                                 "common_control_vector_load_one",uVar3);
                }
                in_RDI->n_embd = -1;
                local_58 = 6;
                goto LAB_0032d9e6;
              }
            }
            in_stack_fffffffffffffe50 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI->data;
            std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe50);
            std::max<unsigned_long>
                      ((unsigned_long *)&stack0xffffffffffffff18,
                       (unsigned_long *)&stack0xffffffffffffff10);
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe80,
                       CONCAT44(iVar1,in_stack_fffffffffffffe78),
                       (value_type_conflict6 *)in_stack_fffffffffffffe70);
            lVar5 = *(long *)((long)&pbVar7[7].field_2 + 8);
            pfVar6 = std::vector<float,_std::allocator<float>_>::data
                               ((vector<float,_std::allocator<float>_> *)0x32d93e);
            iVar1 = in_RDI->n_embd * (local_88 + -1);
            for (local_10c = 0; local_10c < in_RDI->n_embd; local_10c = local_10c + 1) {
              pfVar6[(long)iVar1 + (long)local_10c] =
                   *(float *)(lVar5 + (long)local_10c * 4) * *local_10 +
                   pfVar6[(long)iVar1 + (long)local_10c];
            }
            local_58 = 0;
          }
          else {
            if (-1 < common_log_verbosity_thold) {
              in_stack_fffffffffffffe70 = common_log_main();
              uVar3 = std::__cxx11::string::c_str();
              common_log_add(in_stack_fffffffffffffe70,GGML_LOG_LEVEL_ERROR,
                             "%s: invalid (non-1D) direction tensor shape in %s\n",
                             "common_control_vector_load_one",uVar3);
            }
            in_RDI->n_embd = -1;
            local_58 = 6;
          }
        }
        else {
          if (-1 < common_log_verbosity_thold) {
            in_stack_fffffffffffffe80 = common_log_main();
            uVar3 = std::__cxx11::string::c_str();
            common_log_add(in_stack_fffffffffffffe80,GGML_LOG_LEVEL_ERROR,
                           "%s: invalid (non-F32) direction tensor type in %s\n",
                           "common_control_vector_load_one",uVar3);
          }
          in_RDI->n_embd = -1;
          local_58 = 6;
        }
      }
LAB_0032d9e6:
      std::__cxx11::string::~string(local_80);
      if (local_58 != 0) break;
    }
    if (in_RDI->n_embd == -1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar4 = common_log_main();
        uVar3 = std::__cxx11::string::c_str();
        common_log_add(pcVar4,GGML_LOG_LEVEL_WARN,
                       "%s: skipping %s due to invalid direction tensors\n",
                       "common_control_vector_load_one",uVar3);
      }
      std::vector<float,_std::allocator<float>_>::clear
                ((vector<float,_std::allocator<float>_> *)0x32da9e);
    }
    gguf_free(local_38);
    ggml_free(local_20);
  }
  return in_RDI;
}

Assistant:

static common_control_vector_data common_control_vector_load_one(const common_control_vector_load_info & load_info) {
    common_control_vector_data result = { -1, {} };

    ggml_context * ctx = nullptr;
    struct gguf_init_params meta_gguf_params = {
        /* .no_alloc = */ false,
        /* .ctx      = */ &ctx,
    };
    struct gguf_context * ctx_gguf = gguf_init_from_file(load_info.fname.c_str(), meta_gguf_params);
    if (!ctx_gguf) {
        LOG_ERR("%s: failed to load control vector file from %s\n", __func__, load_info.fname.c_str());
        return result;
    }

    int32_t n_tensors = gguf_get_n_tensors(ctx_gguf);
    if (n_tensors == 0) {
        LOG_WRN("%s: no direction tensors found in %s\n", __func__, load_info.fname.c_str());
    }

    for (int i = 0; i < n_tensors; i++) {
        std::string name = gguf_get_tensor_name(ctx_gguf, i);

        int layer_idx = -1;

        // split on '.'
        size_t dotpos = name.find('.');
        if (dotpos != std::string::npos && name.substr(0, dotpos) == "direction") {
            try {
                layer_idx = std::stoi(name.substr(dotpos + 1));
            } catch (...) {
                layer_idx = -1;
            }
        }
        if (layer_idx < 0) {
            LOG_ERR("%s: invalid/unparsable direction tensor layer index in %s\n", __func__, load_info.fname.c_str());
            result.n_embd = -1;
            break;
        } else if (layer_idx == 0) {
            LOG_ERR("%s: invalid (zero) direction tensor layer index in %s\n", __func__, load_info.fname.c_str());
            result.n_embd = -1;
            break;
        }

        struct ggml_tensor * tensor = ggml_get_tensor(ctx, name.c_str());
        if (tensor->type != GGML_TYPE_F32) {
            LOG_ERR("%s: invalid (non-F32) direction tensor type in %s\n", __func__, load_info.fname.c_str());
            result.n_embd = -1;
            break;
        }
        if (ggml_n_dims(tensor) != 1) {
            LOG_ERR("%s: invalid (non-1D) direction tensor shape in %s\n", __func__, load_info.fname.c_str());
            result.n_embd = -1;
            break;
        }

        if (result.n_embd == -1) {
            result.n_embd = ggml_nelements(tensor);
        } else if (ggml_nelements(tensor) != result.n_embd) {
            LOG_ERR("%s: direction tensor in %s does not match previous dimensions\n", __func__, load_info.fname.c_str());
            result.n_embd = -1;
            break;
        }

        // extend if necessary - do not store data for layer 0 (it's not used)
        result.data.resize(std::max(result.data.size(), static_cast<size_t>(result.n_embd * layer_idx)), 0.0f);

        const float * src = (const float *) tensor->data;
        float * dst = result.data.data() + result.n_embd * (layer_idx - 1);  // layer 1 at [0]
        for (int j = 0; j < result.n_embd; j++) {
            dst[j] += src[j] * load_info.strength;  // allows multiple directions for same layer in same file
        }

    }

    if (result.n_embd == -1) {
        LOG_WRN("%s: skipping %s due to invalid direction tensors\n", __func__, load_info.fname.c_str());
        result.data.clear();
    }

    gguf_free(ctx_gguf);
    ggml_free(ctx);

    return result;
}